

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.cpp
# Opt level: O0

bool ArgumentsParse(int argc,char **argv,Arguments *args)

{
  int iVar1;
  ulong uVar2;
  undefined1 local_50 [4];
  int opt;
  getopt_context_t ctx;
  Arguments *args_local;
  char **argv_local;
  int argc_local;
  
  ctx._40_8_ = args;
  iVar1 = getopt_create_context((getopt_context_t *)local_50,argc,argv,option_list);
  if (iVar1 < 0) {
    printf("error while creating getopt ctx, bad options-list?");
    argv_local._7_1_ = false;
  }
  else {
    while (iVar1 = getopt_next((getopt_context_t *)local_50), iVar1 != -1) {
      switch(iVar1) {
      case 1:
        std::__cxx11::string::operator=((string *)ctx._40_8_,(char *)ctx._24_8_);
        break;
      case 2:
        std::__cxx11::string::operator=((string *)(ctx._40_8_ + 0x20),(char *)ctx._24_8_);
        break;
      case 3:
        iVar1 = atoi((char *)ctx._24_8_);
        *(int *)(ctx._40_8_ + 0x40) = iVar1;
        break;
      case 4:
        iVar1 = atoi((char *)ctx._24_8_);
        *(int *)(ctx._40_8_ + 0x44) = iVar1;
        break;
      case 5:
        iVar1 = atoi((char *)ctx._24_8_);
        *(bool *)(ctx._40_8_ + 0x48) = iVar1 != 0;
        break;
      default:
        break;
      case 0x21:
        printf("live-glsl: invalid use of flag %s\n",ctx._24_8_);
        return false;
      case 0x2b:
        printf("live-glsl: got argument without flag: %s\n",ctx._24_8_);
        return false;
      case 0x3f:
        printf("live-glsl: unknown flag %s\n",ctx._24_8_);
        return false;
      }
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      argv_local._7_1_ = true;
    }
    else {
      printf("live-glsl: no input file (--input [path])\n");
      argv_local._7_1_ = false;
    }
  }
  return argv_local._7_1_;
}

Assistant:

bool ArgumentsParse(int argc, const char** argv, Arguments& args) {
    getopt_context_t ctx;
    if (getopt_create_context(&ctx, argc, argv, option_list) < 0) {
        printf( "error while creating getopt ctx, bad options-list?" );
        return false;
    }

    int opt = 0;
    while ((opt = getopt_next(&ctx)) != -1) {
        switch (opt) {
            case '+':
                printf("live-glsl: got argument without flag: %s\n", ctx.current_opt_arg);
                return false;
            case '?':
                printf("live-glsl: unknown flag %s\n", ctx.current_opt_arg);
                return false;
            case '!':
                printf("live-glsl: invalid use of flag %s\n", ctx.current_opt_arg);
                return false;
            case OPTION_INPUT:
                args.Input = ctx.current_opt_arg;
                break;
            case OPTION_OUTPUT:
                args.Output = ctx.current_opt_arg;
                break;
            case OPTION_WIDTH:
                args.Width = atoi(ctx.current_opt_arg);
                break;
            case OPTION_HEIGHT:
                args.Height = atoi(ctx.current_opt_arg);
                break;
            case OPTION_INI:
                args.EnableIni = (bool)atoi(ctx.current_opt_arg);
                break;
            default:
                break;
        }
    }
    if (args.Input.empty()) {
        printf("live-glsl: no input file (--input [path])\n");
        return false;
    }
    return true;
}